

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

bool __thiscall vkt::memory::anon_unknown_0::MemoryTestInstance::prepare(MemoryTestInstance *this)

{
  value_type pCVar1;
  TestContext *this_00;
  TestLog *log_00;
  PrepareContext *pPVar2;
  Context *context;
  Memory *memory;
  Command *pCVar3;
  reference ppCVar4;
  PtrData<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  in_stack_fffffffffffffd18;
  TestError *e;
  Command *command;
  size_t cmdNdx;
  PtrData<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  local_198;
  PtrData<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  *local_188;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  TestLog *log;
  MemoryTestInstance *this_local;
  
  this_00 = vkt::Context::getTestContext((this->super_TestInstance).m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  section.m_log = log_00;
  de::toString<unsigned_int>(&local_a8,&this->m_memoryTypeNdx);
  std::operator+(&local_88,"MemoryType",&local_a8);
  std::operator+(&local_68,&local_88,"Prepare");
  de::toString<unsigned_long>(&local_d8,&this->m_iteration);
  std::operator+(&local_48,&local_68,&local_d8);
  de::toString<unsigned_int>(&local_158,&this->m_memoryTypeNdx);
  std::operator+(&local_138,"Memory type ",&local_158);
  std::operator+(&local_118,&local_138," prepare iteration");
  de::toString<unsigned_long>(&local_178,&this->m_iteration);
  std::operator+(&local_f8,&local_118,&local_178);
  tcu::ScopedLogSection::ScopedLogSection(&local_28,log_00,&local_48,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  pPVar2 = (PrepareContext *)operator_new(0x70);
  context = de::details::
            UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
            ::operator*(&(this->m_renderContext).
                         super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
                       );
  memory = de::details::
           UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
           ::operator*(&(this->m_memory).
                        super_UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
                      );
  PrepareContext::PrepareContext(pPVar2,context,memory);
  de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>::DefaultDeleter
            ((DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext> *)
             ((long)&cmdNdx + 7));
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::MovePtr((MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
             *)&local_198);
  local_188 = de::details::MovePtr::operator_cast_to_PtrData(&local_198,(MovePtr *)pPVar2);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::operator=(&this->m_prepareContext,in_stack_fffffffffffffd18);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::~MovePtr((MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
              *)&local_198);
  command = (Command *)0x0;
  while( true ) {
    pCVar3 = (Command *)
             std::
             vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
             ::size(&this->m_commands);
    if (pCVar3 <= command) break;
    ppCVar4 = std::
              vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ::operator[](&this->m_commands,(size_type)command);
    pCVar1 = *ppCVar4;
    pPVar2 = de::details::
             UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
             ::operator*(&(this->m_prepareContext).
                          super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
                        );
    (*pCVar1->_vptr_Command[5])(pCVar1,pPVar2);
    command = (Command *)((long)&command->_vptr_Command + 1);
  }
  this->m_stage = (StageFunc)execute;
  *(undefined8 *)&this->field_0x258 = 0;
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  return true;
}

Assistant:

bool MemoryTestInstance::prepare (void)
{
	TestLog&					log		= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section	(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Prepare" + de::toString(m_iteration),
											  "Memory type " + de::toString(m_memoryTypeNdx) + " prepare iteration" + de::toString(m_iteration));

	m_prepareContext = MovePtr<PrepareContext>(new PrepareContext(*m_renderContext, *m_memory));

	DE_ASSERT(!m_commands.empty());

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.prepare(*m_prepareContext);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to prepare, got exception: " + string(e.getMessage()));
			return nextMemoryType();
		}
	}

	m_stage = &MemoryTestInstance::execute;
	return true;
}